

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::FreeHeapBlock(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *this,SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>
                      *heapBlock)

{
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  SmallHeapBlockT<MediumAllocationBlockAttributes>::Reset
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock
            (&heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,
             &this->emptyBlockList->
              super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>);
  this->emptyBlockList = heapBlock;
  (this->super_HeapBucket).emptyHeapBlockCount = (this->super_HeapBucket).emptyHeapBlockCount + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::FreeHeapBlock(TBlockType * heapBlock)
{
    heapBlock->Reset();
    heapBlock->SetNextBlock(emptyBlockList);
    emptyBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    this->emptyHeapBlockCount++;
#endif
}